

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O1

bool __thiscall
PDFUsedFont::EnumeratePaths
          (PDFUsedFont *this,IOutlineEnumerator *target,UIntList *inGlyphsList,double inFontSize)

{
  bool bVar1;
  FT_Pos FVar2;
  _List_node_base *p_Var3;
  
  target->mFontScale = inFontSize;
  p_Var3 = (inGlyphsList->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)inGlyphsList) {
    bVar1 = true;
  }
  else {
    do {
      bVar1 = FreeTypeFaceWrapper::GetGlyphOutline
                        (&this->mFaceWrapper,*(uint *)&p_Var3[1]._M_next,
                         &target->super_IOutlineEnumerator);
      if (!bVar1) {
        return bVar1;
      }
      FVar2 = FreeTypeFaceWrapper::GetGlyphWidth(&this->mFaceWrapper,*(uint *)&p_Var3[1]._M_next);
      target->mBase_x = ((double)FVar2 * inFontSize) / 1000.0 + target->mBase_x;
      target->mBase_y = target->mBase_y + 0.0;
      p_Var3 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var3->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)inGlyphsList);
  }
  return bVar1;
}

Assistant:

bool PDFUsedFont::EnumeratePaths(IOutlineEnumerator& target, const UIntList& inGlyphsList,double inFontSize)
{
	bool status = true;
    target.BeginEnum(inFontSize);
	for( UIntList::const_iterator it = inGlyphsList.begin(); it != inGlyphsList.end(); ++it )
    {
		status = mFaceWrapper.GetGlyphOutline(*it, target);
		if (!status) break;

		// Keep track of glyphs' advance
		double adv = mFaceWrapper.GetGlyphWidth(*it);
		target.MoveBasepoint(adv * inFontSize / 1000.0, 0);
    }
	return status;
}